

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

void fs_prepare_cb(uv_prepare_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_metrics_t metrics;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_metrics_info(uVar2,&metrics);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a != 0) {
    pcVar4 = "0";
    pcVar3 = "uv_metrics_info(uv_default_loop(), &metrics)";
    uVar2 = 0xf8;
LAB_0015abc1:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
    abort();
  }
  if (pool_events_counter == 1) {
    eval_a = metrics.events;
    eval_b = metrics.events_waiting;
    if (metrics.events != metrics.events_waiting) {
      pcVar4 = "metrics.events_waiting";
      pcVar3 = "metrics.events";
      uVar2 = 0xfb;
      goto LAB_0015abc1;
    }
  }
  else if (6 < pool_events_counter) {
    uv_prepare_stop(handle);
    pool_events_counter = -0x2a;
  }
  return;
}

Assistant:

static void fs_prepare_cb(uv_prepare_t* handle) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));

  if (pool_events_counter == 1)
    ASSERT_EQ(metrics.events, metrics.events_waiting);

  if (pool_events_counter < 7)
    return;

  uv_prepare_stop(handle);
  pool_events_counter = -42;
}